

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

int enet_protocol_send_reliable_outgoing_commands(ENetHost *host,ENetPeer *peer)

{
  byte *pbVar1;
  ENetList *pEVar2;
  ENetList *position;
  undefined8 *puVar3;
  short *psVar4;
  ushort uVar5;
  ulong uVar6;
  _ENetListNode *p_Var7;
  _ENetListNode *p_Var8;
  _ENetListNode *p_Var9;
  _ENetListNode *p_Var10;
  _ENetListNode *p_Var11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  void *data;
  byte bVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  _ENetListNode *p_Var22;
  _ENetListNode *position_00;
  long lVar23;
  bool bVar24;
  
  lVar19 = host->commandCount * 0x32 + 0x6c;
  lVar23 = host->bufferCount * 0x10 + 0x6b8;
  pEVar2 = &peer->outgoingReliableCommands;
  p_Var22 = (peer->outgoingReliableCommands).sentinel.next;
  if (p_Var22 == &pEVar2->sentinel) {
    iVar15 = 1;
LAB_00107381:
    host->commandCount = (lVar19 + -0x6c >> 1) * -0x70a3d70a3d70a3d7;
    host->bufferCount = lVar23 + -0x6b8 >> 4;
    return iVar15;
  }
  position = &peer->sentReliableCommands;
  bVar12 = false;
  iVar14 = 1;
  bVar13 = false;
LAB_001070b7:
  position_00 = p_Var22;
  do {
    bVar17 = *(byte *)((long)&position_00[2].previous + 1);
    if ((ulong)bVar17 < peer->channelCount) {
      uVar5 = *(ushort *)&position_00[1].next;
      uVar18 = (uint)(uVar5 >> 0xc);
      bVar24 = peer->channels == (ENetChannel *)0x0;
      if (bVar24) goto LAB_0010715b;
      if (!bVar12) {
        lVar20 = (long)peer->channels->reliableWindows + ((ulong)((uint)bVar17 * 0x50) - 6);
        bVar12 = false;
        if (((uVar5 & 0xfff) == 0 && *(short *)((long)&position_00[2].next + 6) == 0) &&
           ((0xfff < *(ushort *)(lVar20 + 6 + (ulong)(uVar18 - 1 & 0xf) * 2) ||
            (bVar17 = (byte)(uVar5 >> 0xc),
            ((0xffU >> (0x10 - bVar17 & 0x1f) | 0xff << bVar17) & (uint)*(ushort *)(lVar20 + 4)) !=
            0)))) goto LAB_00107138;
        goto LAB_0010715d;
      }
LAB_00107138:
      position_00 = position_00->next;
      bVar12 = true;
    }
    else {
      uVar18 = (uint)(*(ushort *)&position_00[1].next >> 0xc);
      bVar24 = true;
LAB_0010715b:
      lVar20 = 0;
LAB_0010715d:
      if (position_00[6].next == (_ENetListNode *)0x0) goto LAB_001071ba;
      if (!bVar13) {
        uVar21 = peer->windowSize * peer->packetThrottle >> 5;
        if (uVar21 <= peer->mtu) {
          uVar21 = peer->mtu;
        }
        if ((uint)*(ushort *)((long)&position_00[2].next + 4) + peer->reliableDataInTransit <=
            uVar21) break;
      }
      position_00 = position_00->next;
      bVar13 = true;
    }
    iVar15 = iVar14;
    if (position_00 == &pEVar2->sentinel) goto LAB_00107381;
  } while( true );
  bVar13 = false;
LAB_001071ba:
  if ((lVar19 < 0x6ac) && (lVar23 < 0xab8)) {
    uVar6 = commandSizes[*(byte *)&position_00[2].previous & 0xf];
    uVar16 = (ulong)peer->mtu - host->packetSize;
    if ((uVar6 <= uVar16) &&
       ((position_00[6].next == (_ENetListNode *)0x0 ||
        ((uint)(ushort)(*(short *)((long)&position_00[2].next + 4) + (short)uVar6) <=
         ((uint)uVar16 & 0xffff))))) {
      p_Var22 = position_00->next;
      if ((!bVar24) && (*(short *)((long)&position_00[2].next + 6) == 0)) {
        *(ushort *)(lVar20 + 4) = *(ushort *)(lVar20 + 4) | (ushort)(1 << (sbyte)uVar18);
        psVar4 = (short *)(lVar20 + 6 + (ulong)uVar18 * 2);
        *psVar4 = *psVar4 + 1;
      }
      psVar4 = (short *)((long)&position_00[2].next + 6);
      *psVar4 = *psVar4 + 1;
      iVar14 = *(int *)&position_00[1].previous;
      if (iVar14 == 0) {
        iVar14 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
        *(int *)&position_00[1].previous = iVar14;
        *(enet_uint32 *)((long)&position_00[1].previous + 4) = peer->timeoutLimit * iVar14;
      }
      if ((position->sentinel).next == &position->sentinel) {
        peer->nextTimeout = iVar14 + host->serviceTime;
      }
      puVar3 = (undefined8 *)((long)host->commands + lVar19 + -0x6c);
      data = enet_list_remove(position_00);
      enet_list_insert(&position->sentinel,data);
      *(enet_uint32 *)((long)&position_00[1].next + 4) = host->serviceTime;
      *(undefined8 **)((long)host->commands + lVar23 + -0x6c) = puVar3;
      *(ulong *)((long)host->commands + lVar23 + -100) = uVar6;
      host->packetSize = host->packetSize + uVar6;
      pbVar1 = (byte *)((long)&host->headerFlags + 3);
      *pbVar1 = *pbVar1 | 8;
      *(undefined2 *)(puVar3 + 6) = *(undefined2 *)&position_00[5].previous;
      p_Var7 = position_00[2].previous;
      p_Var8 = position_00[3].next;
      p_Var9 = position_00[3].previous;
      p_Var10 = position_00[4].next;
      p_Var11 = position_00[5].next;
      puVar3[4] = position_00[4].previous;
      puVar3[5] = p_Var11;
      puVar3[2] = p_Var9;
      puVar3[3] = p_Var10;
      *puVar3 = p_Var7;
      puVar3[1] = p_Var8;
      if (position_00[6].next == (_ENetListNode *)0x0) {
        lVar23 = lVar23 + 0x10;
      }
      else {
        *(ulong *)((long)host->commands + lVar23 + -0x5c) =
             (long)&(position_00[6].next[1].next)->next + (ulong)*(uint *)&position_00[2].next;
        uVar5 = *(ushort *)((long)&position_00[2].next + 4);
        *(ulong *)((long)host->commands + lVar23 + -0x54) = (ulong)uVar5;
        host->packetSize = host->packetSize + (ulong)uVar5;
        peer->reliableDataInTransit = peer->reliableDataInTransit + (uint)uVar5;
        lVar23 = lVar23 + 0x20;
      }
      peer->packetsSent = peer->packetsSent + 1;
      lVar19 = lVar19 + 0x32;
      iVar14 = 0;
      iVar15 = 0;
      if (p_Var22 == &pEVar2->sentinel) goto LAB_00107381;
      goto LAB_001070b7;
    }
  }
  host->continueSending = 1;
  iVar15 = 0;
  goto LAB_00107381;
}

Assistant:

static int
enet_protocol_send_reliable_outgoing_commands (ENetHost * host, ENetPeer * peer)
{
    ENetProtocol * command = & host -> commands [host -> commandCount];
    ENetBuffer * buffer = & host -> buffers [host -> bufferCount];
    ENetOutgoingCommand * outgoingCommand;
    ENetListIterator currentCommand;
    ENetChannel *channel;
    enet_uint16 reliableWindow;
    size_t commandSize;
    int windowExceeded = 0, windowWrap = 0, canPing = 1;

    currentCommand = enet_list_begin (& peer -> outgoingReliableCommands);
    
    while (currentCommand != enet_list_end (& peer -> outgoingReliableCommands))
    {
       outgoingCommand = (ENetOutgoingCommand *) currentCommand;

       channel = outgoingCommand -> command.header.channelID < peer -> channelCount ? & peer -> channels [outgoingCommand -> command.header.channelID] : NULL;
       reliableWindow = outgoingCommand -> reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
       if (channel != NULL)
       {
           if (! windowWrap &&      
               outgoingCommand -> sendAttempts < 1 && 
               ! (outgoingCommand -> reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) &&
               (channel -> reliableWindows [(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE ||
                 channel -> usedReliableWindows & ((((1 << ENET_PEER_FREE_RELIABLE_WINDOWS) - 1) << reliableWindow) | 
                   (((1 << ENET_PEER_FREE_RELIABLE_WINDOWS) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow)))))
             windowWrap = 1;
          if (windowWrap)
          {
             currentCommand = enet_list_next (currentCommand);
 
             continue;
          }
       }
 
       if (outgoingCommand -> packet != NULL)
       {
          if (! windowExceeded)
          {
             enet_uint32 windowSize = (peer -> packetThrottle * peer -> windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;
             
             if (peer -> reliableDataInTransit + outgoingCommand -> fragmentLength > ENET_MAX (windowSize, peer -> mtu))
               windowExceeded = 1;
          }
          if (windowExceeded)
          {
             currentCommand = enet_list_next (currentCommand);

             continue;
          }
       }

       canPing = 0;

       commandSize = commandSizes [outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK];
       if (command >= & host -> commands [sizeof (host -> commands) / sizeof (ENetProtocol)] ||
           buffer + 1 >= & host -> buffers [sizeof (host -> buffers) / sizeof (ENetBuffer)] ||
           peer -> mtu - host -> packetSize < commandSize ||
           (outgoingCommand -> packet != NULL && 
             (enet_uint16) (peer -> mtu - host -> packetSize) < (enet_uint16) (commandSize + outgoingCommand -> fragmentLength)))
       {
          host -> continueSending = 1;
          
          break;
       }

       currentCommand = enet_list_next (currentCommand);

       if (channel != NULL && outgoingCommand -> sendAttempts < 1)
       {
          channel -> usedReliableWindows |= 1 << reliableWindow;
          ++ channel -> reliableWindows [reliableWindow];
       }

       ++ outgoingCommand -> sendAttempts;
 
       if (outgoingCommand -> roundTripTimeout == 0)
       {
          outgoingCommand -> roundTripTimeout = peer -> roundTripTime + 4 * peer -> roundTripTimeVariance;
          outgoingCommand -> roundTripTimeoutLimit = peer -> timeoutLimit * outgoingCommand -> roundTripTimeout;
       }

       if (enet_list_empty (& peer -> sentReliableCommands))
         peer -> nextTimeout = host -> serviceTime + outgoingCommand -> roundTripTimeout;

       enet_list_insert (enet_list_end (& peer -> sentReliableCommands),
                         enet_list_remove (& outgoingCommand -> outgoingCommandList));

       outgoingCommand -> sentTime = host -> serviceTime;

       buffer -> data = command;
       buffer -> dataLength = commandSize;

       host -> packetSize += buffer -> dataLength;
       host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;

       * command = outgoingCommand -> command;

       if (outgoingCommand -> packet != NULL)
       {
          ++ buffer;
          
          buffer -> data = outgoingCommand -> packet -> data + outgoingCommand -> fragmentOffset;
          buffer -> dataLength = outgoingCommand -> fragmentLength;

          host -> packetSize += outgoingCommand -> fragmentLength;

          peer -> reliableDataInTransit += outgoingCommand -> fragmentLength;
       }

       ++ peer -> packetsSent;
        
       ++ command;
       ++ buffer;
    }

    host -> commandCount = command - host -> commands;
    host -> bufferCount = buffer - host -> buffers;

    return canPing;
}